

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O1

DLS_Data * Timidity::LoadDLS(FILE *src)

{
  ULONG UVar1;
  INSTHEADER *pIVar2;
  WSMPL *pWVar3;
  CONNECTIONLIST *pCVar4;
  POOLTABLE *pPVar5;
  uint uVar6;
  DWORD DVar7;
  uint uVar8;
  DLS_Data *data;
  RIFF_Chunk *pRVar9;
  DLS_Region *pDVar10;
  RIFF_Chunk *pRVar11;
  DLS_Wave *pDVar12;
  RIFF_Chunk *pRVar13;
  RIFF_Chunk *pRVar14;
  RIFF_Chunk *pRVar15;
  char **ppcVar16;
  ulong uVar17;
  RIFF_Chunk *pRVar18;
  DLS_Instrument *pDVar19;
  size_t sVar20;
  
  data = (DLS_Data *)malloc(0x50);
  if (data != (DLS_Data *)0x0) {
    data->copyright = (char *)0x0;
    data->comments = (char *)0x0;
    data->name = (char *)0x0;
    data->artist = (char *)0x0;
    data->ptblList = (POOLCUE *)0x0;
    data->waveList = (DLS_Wave *)0x0;
    data->instruments = (DLS_Instrument *)0x0;
    data->ptbl = (POOLTABLE *)0x0;
    data->chunk = (RIFF_Chunk *)0x0;
    *(undefined8 *)&data->cInstruments = 0;
    pRVar9 = LoadRIFF(src);
    data->chunk = pRVar9;
    if (pRVar9 != (RIFF_Chunk *)0x0) {
      pRVar9 = pRVar9->child;
      if (pRVar9 == (RIFF_Chunk *)0x0) {
        return data;
      }
      do {
        DVar7 = pRVar9->magic;
        if (DVar7 == 0x5453494c) {
          DVar7 = pRVar9->subtype;
        }
        if ((int)DVar7 < 0x6c627470) {
          if (DVar7 == 0x4f464e49) {
            for (pRVar13 = pRVar9->child; pRVar13 != (RIFF_Chunk *)0x0; pRVar13 = pRVar13->next) {
              DVar7 = pRVar13->magic;
              if (DVar7 == 0x5453494c) {
                DVar7 = pRVar13->subtype;
              }
              if ((int)DVar7 < 0x544d4349) {
                ppcVar16 = &data->name;
                if ((DVar7 == 0x4d414e49) || (ppcVar16 = &data->copyright, DVar7 == 0x504f4349)) {
LAB_0032515b:
                  *ppcVar16 = (char *)pRVar13->data;
                }
              }
              else {
                ppcVar16 = &data->artist;
                if ((DVar7 == 0x54524149) || (ppcVar16 = &data->comments, DVar7 == 0x544d4349))
                goto LAB_0032515b;
              }
            }
          }
          else if (DVar7 == 0x686c6f63) {
            DVar7 = *(DWORD *)pRVar9->data;
            data->cInstruments = DVar7;
            FreeInstruments(data);
            sVar20 = (size_t)(int)(DVar7 * 0x28);
            pDVar12 = (DLS_Wave *)malloc(sVar20);
            data->instruments = (DLS_Instrument *)pDVar12;
            goto LAB_0032502e;
          }
        }
        else if (DVar7 == 0x6c627470) {
          pPVar5 = (POOLTABLE *)pRVar9->data;
          data->ptbl = pPVar5;
          data->ptblList = (POOLCUE *)((long)&pPVar5->cbSize + (ulong)pPVar5->cbSize);
          UVar1 = pPVar5->cCues;
          if (data->waveList != (DLS_Wave *)0x0) {
            free(data->waveList);
          }
          sVar20 = (size_t)(int)(UVar1 * 0x28);
          pDVar12 = (DLS_Wave *)malloc(sVar20);
          data->waveList = pDVar12;
LAB_0032502e:
          if (pDVar12 != (DLS_Wave *)0x0) {
            memset(pDVar12,0,sVar20);
          }
        }
        else if (DVar7 == 0x6c707677) {
          pRVar13 = pRVar9->child;
          if (pRVar13 != (RIFF_Chunk *)0x0) {
            uVar17 = 0;
            do {
              DVar7 = pRVar13->magic;
              if (DVar7 == 0x5453494c) {
                DVar7 = pRVar13->subtype;
              }
              if ((DVar7 == 0x65766177) && ((uint)uVar17 < data->ptbl->cCues)) {
                pRVar15 = pRVar13->child;
                if (pRVar15 != (RIFF_Chunk *)0x0) {
                  pDVar12 = data->waveList + uVar17;
                  do {
                    DVar7 = pRVar15->magic;
                    if (DVar7 == 0x5453494c) {
                      DVar7 = pRVar15->subtype;
                    }
                    if (DVar7 == 0x706d7377) {
                      pWVar3 = (WSMPL *)pRVar15->data;
                      uVar8 = pWVar3->cbSize;
                      pDVar12->wsmp = pWVar3;
                      pDVar12->wsmp_loop = (WLOOP *)((long)&pWVar3->cbSize + (ulong)uVar8);
                    }
                    else if (DVar7 == 0x61746164) {
                      pDVar12->data = pRVar15->data;
                      pDVar12->length = pRVar15->length;
                    }
                    else if (DVar7 == 0x20746d66) {
                      pDVar12->format = (WaveFMT *)pRVar15->data;
                    }
                    pRVar15 = pRVar15->next;
                  } while (pRVar15 != (RIFF_Chunk *)0x0);
                }
                uVar17 = (ulong)((uint)uVar17 + 1);
              }
              pRVar13 = pRVar13->next;
            } while (pRVar13 != (RIFF_Chunk *)0x0);
          }
        }
        else if ((DVar7 == 0x736e696c) && (pRVar13 = pRVar9->child, pRVar13 != (RIFF_Chunk *)0x0)) {
          uVar8 = 0;
          do {
            DVar7 = pRVar13->magic;
            if (DVar7 == 0x5453494c) {
              DVar7 = pRVar13->subtype;
            }
            uVar6 = uVar8;
            if ((DVar7 == 0x20736e69) && (uVar8 < data->cInstruments)) {
              pRVar15 = pRVar13->child;
              uVar6 = uVar8 + 1;
              if (pRVar15 != (RIFF_Chunk *)0x0) {
                pDVar19 = data->instruments + uVar8;
                do {
                  DVar7 = pRVar15->magic;
                  if (DVar7 == 0x5453494c) {
                    DVar7 = pRVar15->subtype;
                  }
                  if ((int)DVar7 < 0x68736e69) {
                    if (DVar7 == 0x3272616c) goto LAB_00324e16;
                    if (DVar7 == 0x4f464e49) {
                      for (pRVar11 = pRVar15->child; pRVar11 != (RIFF_Chunk *)0x0;
                          pRVar11 = pRVar11->next) {
                        DVar7 = pRVar11->magic;
                        if (DVar7 == 0x5453494c) {
                          DVar7 = pRVar11->subtype;
                        }
                        if (DVar7 == 0x4d414e49) {
                          pDVar19->name = (char *)pRVar11->data;
                        }
                      }
                    }
                  }
                  else if (DVar7 == 0x7472616c) {
LAB_00324e16:
                    for (pRVar11 = pRVar15->child; pRVar11 != (RIFF_Chunk *)0x0;
                        pRVar11 = pRVar11->next) {
                      DVar7 = pRVar11->magic;
                      if (DVar7 == 0x5453494c) {
                        DVar7 = pRVar11->subtype;
                      }
                      if ((DVar7 == 0x32747261) || (DVar7 == 0x31747261)) {
                        pCVar4 = (CONNECTIONLIST *)pRVar11->data;
                        uVar8 = pCVar4->cbSize;
                        pDVar19->art = pCVar4;
                        pDVar19->artList = (CONNECTION *)((long)&pCVar4->cbSize + (ulong)uVar8);
                        break;
                      }
                    }
                  }
                  else if (DVar7 == 0x6e67726c) {
                    pRVar11 = pRVar15->child;
                    if (pRVar11 != (RIFF_Chunk *)0x0) {
                      uVar17 = 0;
                      do {
                        DVar7 = pRVar11->magic;
                        if (DVar7 == 0x5453494c) {
                          DVar7 = pRVar11->subtype;
                        }
                        if (((DVar7 == 0x326e6772) || (DVar7 == 0x206e6772)) &&
                           ((uint)uVar17 < pDVar19->header->cRegions)) {
                          pRVar14 = pRVar11->child;
                          if (pRVar14 != (RIFF_Chunk *)0x0) {
                            pDVar10 = pDVar19->regions + uVar17;
                            do {
                              DVar7 = pRVar14->magic;
                              if (DVar7 == 0x5453494c) {
                                DVar7 = pRVar14->subtype;
                              }
                              if ((int)DVar7 < 0x6b6e6c77) {
                                if (DVar7 == 0x3272616c) {
LAB_00324ef0:
                                  for (pRVar18 = pRVar14->child; pRVar18 != (RIFF_Chunk *)0x0;
                                      pRVar18 = pRVar18->next) {
                                    DVar7 = pRVar18->magic;
                                    if (DVar7 == 0x5453494c) {
                                      DVar7 = pRVar18->subtype;
                                    }
                                    if ((DVar7 == 0x32747261) || (DVar7 == 0x31747261)) {
                                      pCVar4 = (CONNECTIONLIST *)pRVar18->data;
                                      uVar8 = pCVar4->cbSize;
                                      pDVar10->art = pCVar4;
                                      pDVar10->artList =
                                           (CONNECTION *)((long)&pCVar4->cbSize + (ulong)uVar8);
                                      break;
                                    }
                                  }
                                }
                                else if (DVar7 == 0x686e6772) {
                                  pDVar10->header = (RGNHEADER *)pRVar14->data;
                                }
                              }
                              else if (DVar7 == 0x6b6e6c77) {
                                pDVar10->wlnk = (WAVELINK *)pRVar14->data;
                              }
                              else if (DVar7 == 0x706d7377) {
                                pWVar3 = (WSMPL *)pRVar14->data;
                                uVar8 = pWVar3->cbSize;
                                pDVar10->wsmp = pWVar3;
                                pDVar10->wsmp_loop = (WLOOP *)((long)&pWVar3->cbSize + (ulong)uVar8)
                                ;
                              }
                              else if (DVar7 == 0x7472616c) goto LAB_00324ef0;
                              pRVar14 = pRVar14->next;
                            } while (pRVar14 != (RIFF_Chunk *)0x0);
                          }
                          uVar17 = (ulong)((uint)uVar17 + 1);
                        }
                        pRVar11 = pRVar11->next;
                      } while (pRVar11 != (RIFF_Chunk *)0x0);
                    }
                  }
                  else if (DVar7 == 0x68736e69) {
                    pIVar2 = (INSTHEADER *)pRVar15->data;
                    pDVar19->header = pIVar2;
                    UVar1 = pIVar2->cRegions;
                    if (pDVar19->regions != (DLS_Region *)0x0) {
                      free(pDVar19->regions);
                    }
                    sVar20 = (size_t)(int)(UVar1 * 0x30);
                    pDVar10 = (DLS_Region *)malloc(sVar20);
                    pDVar19->regions = pDVar10;
                    if (pDVar10 != (DLS_Region *)0x0) {
                      memset(pDVar10,0,sVar20);
                    }
                  }
                  pRVar15 = pRVar15->next;
                } while (pRVar15 != (RIFF_Chunk *)0x0);
              }
            }
            uVar8 = uVar6;
            pRVar13 = pRVar13->next;
          } while (pRVar13 != (RIFF_Chunk *)0x0);
        }
        pRVar9 = pRVar9->next;
        if (pRVar9 == (RIFF_Chunk *)0x0) {
          return data;
        }
      } while( true );
    }
    FreeDLS(data);
  }
  return (DLS_Data *)0x0;
}

Assistant:

DLS_Data *LoadDLS(FILE *src)
{
	RIFF_Chunk *chunk;
	DLS_Data *data = (DLS_Data *)malloc(sizeof(*data));
	if ( !data ) {
		__Sound_SetError(ERR_OUT_OF_MEMORY);
		return NULL;
	}
	memset(data, 0, sizeof(*data));

	data->chunk = LoadRIFF(src);
	if ( !data->chunk ) {
		FreeDLS(data);
		return NULL;
	}

	for ( chunk = data->chunk->child; chunk; chunk = chunk->next ) {
		DWORD magic = (chunk->magic == FOURCC_LIST) ? chunk->subtype : chunk->magic;
		switch(magic) {
			case FOURCC_COLH:
				Parse_colh(data, chunk);
				break;
			case FOURCC_LINS:
				Parse_lins(data, chunk);
				break;
			case FOURCC_PTBL:
				Parse_ptbl(data, chunk);
				break;
			case FOURCC_WVPL:
				Parse_wvpl(data, chunk);
				break;
			case FOURCC_INFO:
				Parse_INFO_DLS(data, chunk);
				break;
		}
	}
	return data;
}